

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDateTime QDateTime::fromString(QStringView string,DateFormat format)

{
  QStringView *pQVar1;
  storage_type_conflict sVar2;
  undefined1 *puVar3;
  char cVar4;
  undefined1 **ppuVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  QTime QVar9;
  long lVar10;
  qsizetype qVar11;
  qlonglong qVar12;
  qlonglong qVar13;
  DateFormat in_ECX;
  undefined4 in_register_00000014;
  storage_type_conflict *psVar14;
  int iVar15;
  Data d;
  Data DVar16;
  Data *this;
  int iVar18;
  storage_type_conflict *psVar19;
  storage_type_conflict *psVar20;
  long in_FS_OFFSET;
  ParsedRfcDateTime PVar21;
  QStringView string_00;
  QStringView string_01;
  QStringView needle;
  QStringView needle_00;
  QLatin1StringView needle_01;
  QLatin1StringView needle_02;
  QStringView string_02;
  QStringView QVar22;
  QStringView haystack;
  QStringView haystack_00;
  QStringView string_03;
  QStringView offsetString;
  QStringView string_04;
  QStringView offsetString_00;
  QStringView needle0;
  QStringView needle0_00;
  bool isMidnight24;
  bool ok_1;
  QTimeZone zone;
  QDate date;
  Data local_130;
  QDate local_128;
  bool local_119;
  Data local_118;
  Data DStack_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  Data local_d8;
  storage_type_conflict *psStack_d0;
  storage_type_conflict *local_c8;
  undefined8 uStack_c0;
  Data local_b8;
  long lStack_b0;
  undefined1 **local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  QDate *pQVar17;
  
  psVar14 = (storage_type_conflict *)CONCAT44(in_register_00000014,format);
  psVar19 = string.m_data;
  d = (Data)string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (psVar19 == (storage_type_conflict *)0x0) goto switchD_0035332f_caseD_2;
  switch(in_ECX) {
  case TextDate:
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (Data)0x6;
    lStack_b0 = 0;
    local_d8.d = (QTimeZonePrivate *)0x100000001;
    uStack_c0 = 0xaaaaaaaaaaaa0020;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_118.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    DStack_110.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_d0 = psVar19;
    local_c8 = psVar14;
    local_a8 = &puStack_a0;
    QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
              ((iterator *)&local_118.s,(QStringTokenizerBase<QStringView,_QChar> *)&local_d8.s);
    iVar8 = 6;
    do {
      if ((char)puStack_100 == '\0') break;
      QVLABase<QStringView>::emplace_back_impl<QStringView_const&>
                ((QVLABase<QStringView> *)&local_b8.s,6,&puStack_a0,(QStringView *)&DStack_110.s);
      QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)&local_118.s);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    ppuVar5 = local_a8;
    if ((lStack_b0 < 5) || ((char)puStack_100 == '\x01')) {
LAB_0035348f:
      QDateTime((QDateTime *)d.d);
    }
    else {
      pQVar17 = &local_128;
      local_128.jd._0_2_ = 0x3a;
      needle0.m_data = (storage_type_conflict *)pQVar17;
      needle0.m_size = 1;
      qVar11 = QtPrivate::findString(*(QStringView *)(local_a8 + 6),0,needle0,CaseSensitive);
      iVar8 = (int)pQVar17;
      if (qVar11 == -1) {
        pQVar17 = &local_128;
        local_128.jd._0_2_ = 0x3a;
        needle0_00.m_data = (storage_type_conflict *)pQVar17;
        needle0_00.m_size = 1;
        qVar11 = QtPrivate::findString(*(QStringView *)(ppuVar5 + 8),0,needle0_00,CaseSensitive);
        iVar8 = (int)pQVar17;
        if (qVar11 == -1) goto LAB_0035348f;
        iVar18 = 3;
        iVar15 = 4;
      }
      else {
        iVar18 = 4;
        iVar15 = 3;
      }
      local_119 = false;
      string_00.m_data = (storage_type_conflict *)&local_119;
      string_00.m_size = (qsizetype)ppuVar5[5];
      qVar12 = QString::toIntegral_helper((QString *)ppuVar5[4],string_00,(bool *)0xa,iVar8);
      if ((int)qVar12 != qVar12) {
        local_119 = false;
        qVar12 = 0;
      }
      qVar13 = 0;
      if ((local_119 == true) &&
         (string_01.m_data = (storage_type_conflict *)&local_119,
         string_01.m_size = *(qsizetype *)((long)local_a8 + (ulong)(uint)(iVar18 << 4) + 8),
         qVar13 = QString::toIntegral_helper
                            (*(QString **)((long)local_a8 + (ulong)(uint)(iVar18 << 4)),string_01,
                             (bool *)0xa,iVar8), (int)qVar13 != qVar13)) {
        local_119 = false;
        qVar13 = 0;
      }
      iVar8 = fromShortMonthName(*(QStringView *)(local_a8 + 2));
      if ((((iVar8 < 1) || (qVar12 == 0)) || ((int)qVar13 == 0)) || (local_119 == false))
      goto LAB_0035348f;
      local_128.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      QDate::QDate(&local_128,(int)qVar13,iVar8,(int)qVar12);
      if (((undefined1 *)0x16d3e147973 < (undefined1 *)(local_128.jd + 0xb69eeff91f)) ||
         (string_03.m_data =
               *(storage_type_conflict **)((long)local_a8 + (ulong)(uint)(iVar15 << 4) + 8),
         string_03.m_size = *(qsizetype *)((long)local_a8 + (ulong)(uint)(iVar15 << 4)),
         QVar9 = fromIsoTimeString(string_03,TextDate,(bool *)0x0), 86399999 < (uint)QVar9.mds))
      goto LAB_0035348f;
      if (lStack_b0 == 5) {
        QDateTime((QDateTime *)d.d,local_128,QVar9,LegacyBehavior);
      }
      else {
        pQVar1 = (QStringView *)(local_a8 + 10);
        lVar10 = pQVar1->m_size;
        puVar3 = local_a8[0xb];
        QVar22 = *pQVar1;
        needle_01.m_data = "UTC";
        needle_01.m_size = 3;
        bVar6 = QtPrivate::startsWith(*pQVar1,needle_01,CaseSensitive);
        if ((!bVar6) &&
           (needle_02.m_data = "GMT", needle_02.m_size = 3,
           bVar6 = QtPrivate::startsWith(QVar22,needle_02,CaseInsensitive), !bVar6))
        goto LAB_0035348f;
        lVar10 = lVar10 + -3;
        if (lVar10 == 0) {
          local_130 = (Data)0x2;
          QDateTime((QDateTime *)d.d,local_128,QVar9,(QTimeZone *)&local_130.s,LegacyBehavior);
        }
        else {
          offsetString_00.m_data = (storage_type_conflict *)(puVar3 + 6);
          offsetString_00.m_size = lVar10;
          iVar8 = fromOffsetString(offsetString_00,&local_119);
          bVar6 = local_119;
          if (local_119 == true) {
            local_130.d = (QTimeZonePrivate *)0x0;
            if ((long)iVar8 + 0xe100U < 0x1c201) {
              local_130.d = (QTimeZonePrivate *)((3 - (ulong)(iVar8 == 0)) + (long)iVar8 * 4);
            }
            QDateTime((QDateTime *)d.d,local_128,QVar9,(QTimeZone *)&local_130.s,LegacyBehavior);
          }
          else {
            QDateTime((QDateTime *)d.d);
          }
          if (bVar6 == false) goto LAB_00353497;
        }
        QTimeZone::~QTimeZone((QTimeZone *)&local_130.s);
      }
    }
LAB_00353497:
    if (local_a8 != &puStack_a0) {
      QtPrivate::sizedFree(local_a8,(long)local_b8.d << 4);
    }
    break;
  case ISODate:
  case ISODateWithMs:
    if ((int)string.m_data < 10) goto switchD_0035332f_caseD_2;
    local_b8.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    string_02.m_data = psVar14;
    string_02.m_size = 10;
    local_b8.s = (ShortData)QDate::fromString(string_02,ISODate);
    if ((undefined1 *)((long)&local_b8.d[0x490c5ffd3].m_id.d.size + 7U) <
        (undefined1 *)0x16d3e147974) {
      if ((int)string.m_data != 10) {
        local_118 = (Data)0x1;
        if ((long)psVar19 < 0xc) {
LAB_00353944:
          QDateTime((QDateTime *)d.d);
        }
        else {
          local_d8._0_2_ = 0x54;
          needle.m_data = (storage_type_conflict *)&local_d8;
          needle.m_size = 1;
          haystack.m_data = psVar14 + 10;
          haystack.m_size = (qsizetype)(psVar19 + -5);
          bVar6 = QtPrivate::startsWith(haystack,needle,CaseInsensitive);
          if ((!bVar6) && (psVar14[10] != L' ')) goto LAB_00353944;
          psVar14 = psVar14 + 0xb;
          psVar20 = (storage_type_conflict *)((long)psVar19 + -0xb);
          local_d8._0_2_ = 0x5a;
          needle_00.m_data = (storage_type_conflict *)&local_d8;
          needle_00.m_size = 1;
          haystack_00.m_data = psVar14;
          haystack_00.m_size = (qsizetype)psVar20;
          bVar6 = QtPrivate::endsWith(haystack_00,needle_00,CaseInsensitive);
          DVar16 = local_118;
          if (bVar6) {
            local_118 = (Data)0x2;
            local_d8 = DVar16;
            QTimeZone::~QTimeZone((QTimeZone *)&local_d8.s);
            psVar20 = psVar19 + -6;
LAB_003538c2:
            local_128.jd = local_128.jd & 0xffffffffffffff00;
            string_04.m_data = psVar14;
            string_04.m_size = (qsizetype)psVar20;
            QVar9 = fromIsoTimeString(string_04,in_ECX,(bool *)&local_128);
            if (86399999 < (uint)QVar9.mds) goto LAB_00353944;
            if ((char)local_128.jd == '\x01') {
              local_d8 = (Data)0x8000000000000000;
              if ((undefined1 *)0xfffffe92c1eb868b <
                  (undefined1 *)((long)&local_b8.d[-0x490c75003].m_id.d.size + 3U)) {
                DVar16.d = (QTimeZonePrivate *)((long)&(local_b8.d)->_vptr_QTimeZonePrivate + 1);
                if ((undefined1 *)((long)&local_b8.d[-0x490c75003].m_id.d.size + 4U) <
                    (undefined1 *)0xfffffe92c1eb868c) {
                  DVar16 = (Data)0x8000000000000000;
                }
                if (!SCARRY8((long)local_b8.d,1)) {
                  local_d8 = DVar16;
                }
              }
              QDate::startOfDay((QDate *)d.d,(QTimeZone *)&local_d8.s);
            }
            else {
              QDateTime((QDateTime *)d.d,(QDate)local_b8.s,QVar9,(QTimeZone *)&local_118.s,
                        LegacyBehavior);
            }
          }
          else {
            uVar7 = (int)psVar20 - 1;
            iVar8 = ((int)uVar7 >> 0x1f & uVar7) - 1;
            lVar10 = (long)(int)uVar7;
            do {
              sVar2 = psVar14[lVar10];
              if ((sVar2 == L'+') || (sVar2 == L'-')) {
                iVar8 = (int)lVar10;
                break;
              }
              bVar6 = 0 < lVar10;
              lVar10 = lVar10 + -1;
            } while (bVar6);
            if ((sVar2 != L'-') && (sVar2 != L'+')) goto LAB_003538c2;
            local_128.jd._0_1_ = 0xaa;
            psVar19 = (storage_type_conflict *)(long)iVar8;
            offsetString.m_size = (long)psVar20 - (long)psVar19;
            offsetString.m_data = psVar14 + (long)psVar19;
            iVar8 = fromOffsetString(offsetString,(bool *)&local_128);
            cVar4 = (char)local_128.jd;
            if ((char)local_128.jd == '\0') {
              QDateTime((QDateTime *)d.d);
            }
            else {
              DVar16.d = (QTimeZonePrivate *)0x0;
              if ((long)iVar8 + 0xe100U < 0x1c201) {
                DVar16.d = (QTimeZonePrivate *)((3 - (ulong)(iVar8 == 0)) + (long)iVar8 * 4);
              }
              local_d8 = local_118;
              local_118 = DVar16;
              QTimeZone::~QTimeZone((QTimeZone *)&local_d8.s);
              psVar20 = psVar19;
            }
            if (cVar4 != '\0') goto LAB_003538c2;
          }
        }
        this = &local_118;
        goto LAB_00353951;
      }
      QDate::startOfDay((QDate *)d.d);
    }
    else {
      QDateTime((QDateTime *)d.d);
    }
    break;
  default:
    goto switchD_0035332f_caseD_2;
  case RFC2822Date:
    QVar22.m_data = psVar14;
    QVar22.m_size = (qsizetype)psVar19;
    PVar21 = rfcDateImpl(QVar22);
    if ((PVar21.date.jd.jd + 0xb69eeff91fU < 0x16d3e147974) &&
       ((uint)PVar21.time.mds.mds < 86400000)) {
      *(undefined1 **)d.d = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = (Data)0x2;
      QDateTime((QDateTime *)d.d,PVar21.date.jd,PVar21.time.mds,(QTimeZone *)&local_b8.s,
                LegacyBehavior);
      QTimeZone::~QTimeZone((QTimeZone *)&local_b8.s);
      lVar10 = (long)PVar21._8_8_ >> 0x20;
      local_b8.d = (QTimeZonePrivate *)0x0;
      if (lVar10 + 0xe100U < 0x1c201) {
        local_b8.d = (QTimeZonePrivate *)((3 - (ulong)(PVar21._8_8_ >> 0x20 == 0)) + lVar10 * 4);
      }
      reviseTimeZone((QDateTimeData *)d.d,(QTimeZone *)&local_b8.s,LegacyBehavior);
      this = &local_b8;
LAB_00353951:
      QTimeZone::~QTimeZone((QTimeZone *)&this->s);
      break;
    }
    goto switchD_0035332f_caseD_2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)d;
  }
LAB_00353b5c:
  __stack_chk_fail();
switchD_0035332f_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QDateTime((QDateTime *)d.d);
    return (QDateTime)(QDateTimePrivate *)d;
  }
  goto LAB_00353b5c;
}

Assistant:

QDateTime QDateTime::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDateTime();

    switch (format) {
    case Qt::RFC2822Date: {
        const ParsedRfcDateTime rfc = rfcDateImpl(string);

        if (!rfc.date.isValid() || !rfc.time.isValid())
            return QDateTime();

        QDateTime dateTime(rfc.date, rfc.time, QTimeZone::UTC);
        dateTime.setTimeZone(QTimeZone::fromSecondsAheadOfUtc(rfc.utcOffset));
        return dateTime;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const int size = string.size();
        if (size < 10)
            return QDateTime();

        QDate date = QDate::fromString(string.first(10), Qt::ISODate);
        if (!date.isValid())
            return QDateTime();
        if (size == 10)
            return date.startOfDay();

        QTimeZone zone = QTimeZone::LocalTime;
        QStringView isoString = string.sliced(10); // trim "yyyy-MM-dd"

        // Must be left with T (or space) and at least one digit for the hour:
        if (isoString.size() < 2
            || !(isoString.startsWith(u'T', Qt::CaseInsensitive)
                 // RFC 3339 (section 5.6) allows a space here.  (It actually
                 // allows any separator one considers more readable, merely
                 // giving space as an example - but let's not go wild !)
                 || isoString.startsWith(u' '))) {
            return QDateTime();
        }
        isoString = isoString.sliced(1); // trim 'T' (or space)

        // Check end of string for Time Zone definition, either Z for UTC or ±HH:mm for Offset
        if (isoString.endsWith(u'Z', Qt::CaseInsensitive)) {
            zone = QTimeZone::UTC;
            isoString.chop(1); // trim 'Z'
        } else {
            // the loop below is faster but functionally equal to:
            // const int signIndex = isoString.indexOf(QRegulargExpression(QStringLiteral("[+-]")));
            int signIndex = isoString.size() - 1;
            Q_ASSERT(signIndex >= 0);
            bool found = false;
            do {
                QChar character(isoString[signIndex]);
                found = character == u'+' || character == u'-';
            } while (!found && --signIndex >= 0);

            if (found) {
                bool ok;
                int offset = fromOffsetString(isoString.sliced(signIndex), &ok);
                if (!ok)
                    return QDateTime();
                isoString = isoString.first(signIndex);
                zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            }
        }

        // Might be end of day (24:00, including variants), which QTime considers invalid.
        // ISO 8601 (section 4.2.3) says that 24:00 is equivalent to 00:00 the next day.
        bool isMidnight24 = false;
        QTime time = fromIsoTimeString(isoString, format, &isMidnight24);
        if (!time.isValid())
            return QDateTime();
        if (isMidnight24) // time is 0:0, but we want the start of next day:
            return date.addDays(1).startOfDay(zone);
        return QDateTime(date, time, zone);
    }
    case Qt::TextDate: {
        QVarLengthArray<QStringView, 6> parts;

        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        // Documented as "ddd MMM d HH:mm:ss yyyy" with optional offset-suffix;
        // and allow time either before or after year.
        if (parts.size() < 5 || it != tokens.end())
            return QDateTime();

        // Year and time can be in either order.
        // Guess which by looking for ':' in the time
        int yearPart = 3;
        int timePart = 3;
        if (parts.at(3).contains(u':'))
            yearPart = 4;
        else if (parts.at(4).contains(u':'))
            timePart = 4;
        else
            return QDateTime();

        bool ok = false;
        int day = parts.at(2).toInt(&ok);
        int year = ok ? parts.at(yearPart).toInt(&ok) : 0;
        int month = fromShortMonthName(parts.at(1));
        if (!ok || year == 0 || day == 0 || month < 1)
            return QDateTime();

        const QDate date(year, month, day);
        if (!date.isValid())
            return QDateTime();

        const QTime time = fromIsoTimeString(parts.at(timePart), format, nullptr);
        if (!time.isValid())
            return QDateTime();

        if (parts.size() == 5)
            return QDateTime(date, time);

        QStringView tz = parts.at(5);
        if (tz.startsWith("UTC"_L1)
            // GMT has long been deprecated as an alias for UTC.
            || tz.startsWith("GMT"_L1, Qt::CaseInsensitive)) {
            tz = tz.sliced(3);
            if (tz.isEmpty())
                return QDateTime(date, time, QTimeZone::UTC);

            int offset = fromOffsetString(tz, &ok);
            return ok ? QDateTime(date, time, QTimeZone::fromSecondsAheadOfUtc(offset))
                      : QDateTime();
        }
        return QDateTime();
    }
    }

    return QDateTime();
}